

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetCMakePropertyCommand.cxx
# Opt level: O1

bool __thiscall
cmGetCMakePropertyCommand::InitialPass
          (cmGetCMakePropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  cmMakefile *pcVar4;
  char *pcVar5;
  int iVar6;
  cmState *this_00;
  char *pcVar7;
  cmGlobalGenerator *pcVar8;
  ulong uVar9;
  string output;
  string variable;
  string local_90;
  long *local_70;
  char *local_68;
  long local_60 [2];
  string local_50;
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (uVar9 < 0x21) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_50);
  }
  else {
    pcVar3 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + pbVar2->_M_string_length);
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NOTFOUND","");
    iVar6 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar6 == 0) {
      pcVar4 = (this->super_cmCommand).Makefile;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"VARIABLES","");
      pcVar7 = cmMakefile::GetProperty(pcVar4,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      pcVar5 = local_68;
      if (pcVar7 != (char *)0x0) {
        strlen(pcVar7);
        std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar5,(ulong)pcVar7);
      }
    }
    else {
      iVar6 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 1));
      if (iVar6 == 0) {
        local_68 = (char *)0x0;
        *(undefined1 *)local_70 = 0;
        pcVar4 = (this->super_cmCommand).Makefile;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"MACROS","");
        pcVar7 = cmMakefile::GetProperty(pcVar4,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = local_68;
        if (pcVar7 != (char *)0x0) {
          strlen(pcVar7);
          std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar5,(ulong)pcVar7);
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 1));
        if (iVar6 == 0) {
          pcVar8 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&local_90,&pcVar8->InstallComponents,";");
          std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1]._M_string_length == 0) {
            pcVar7 = (char *)0x0;
          }
          else {
            this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
            pcVar7 = cmState::GetGlobalProperty
                               (this_00,(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 1);
          }
          pcVar5 = local_68;
          if (pcVar7 != (char *)0x0) {
            strlen(pcVar7);
            std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar5,(ulong)pcVar7);
          }
        }
      }
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_50,(char *)local_70);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return 0x20 < uVar9;
}

Assistant:

bool cmGetCMakePropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string variable = args[0];
  std::string output = "NOTFOUND";

  if ( args[1] == "VARIABLES" )
    {
    if (const char* varsProp = this->Makefile->GetProperty("VARIABLES"))
      {
      output = varsProp;
      }
    }
  else if ( args[1] == "MACROS" )
    {
    output.clear();
    if (const char* macrosProp = this->Makefile->GetProperty("MACROS"))
      {
      output = macrosProp;
      }
    }
  else if ( args[1] == "COMPONENTS" )
    {
    const std::set<std::string>* components
      = this->Makefile->GetGlobalGenerator()->GetInstallComponents();
    output = cmJoin(*components, ";");
    }
  else
    {
    const char *prop = 0;
    if (!args[1].empty())
      {
      prop = this->Makefile->GetState()->GetGlobalProperty(args[1]);
      }
    if (prop)
      {
      output = prop;
      }
    }

  this->Makefile->AddDefinition(variable, output.c_str());

  return true;
}